

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

RIP * __thiscall ASDCP::MXF::RIP::WriteToFile(RIP *this,FileWriter *Writer)

{
  int iVar1;
  bool bVar2;
  uint in_EDX;
  uint uVar3;
  FrameBuffer Buffer;
  MemIOWriter MemWRT;
  
  if (*(long *)(Writer + 0x70) != 0) {
    FrameBuffer::FrameBuffer(&Buffer);
    iVar1 = *(int *)(Writer + 0x90);
    FrameBuffer::Capacity((FrameBuffer *)this,(ui32_t)&Buffer);
    if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
      Dictionary::Type(*(Dictionary **)(Writer + 0x70),MDD_RandomIndexMetadata);
      (**(code **)(*(long *)Writer + 0x60))(&MemWRT,Writer);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&MemWRT);
      Kumu::Result_t::~Result_t((Result_t *)&MemWRT);
      if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
        Kumu::Result_t::operator()((int *)&MemWRT,ASDCP::RESULT_KLV_CODING);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&MemWRT);
        Kumu::Result_t::~Result_t((Result_t *)&MemWRT);
        Kumu::MemIOWriter::MemIOWriter(&MemWRT,Buffer.m_Data,Buffer.m_Capacity);
        bVar2 = SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Archive
                          ((SimpleArray<ASDCP::MXF::RIP::PartitionPair> *)(Writer + 0x78),&MemWRT);
        if ((bVar2) && ((ulong)MemWRT.m_size + 4 <= (ulong)MemWRT.m_capacity)) {
          uVar3 = iVar1 * 0xc + 0x18;
          *(uint *)(MemWRT.m_p + MemWRT.m_size) =
               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
          Buffer.m_Size = MemWRT.m_size + 4;
          MemWRT.m_size = Buffer.m_Size;
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
        }
        if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
          Kumu::FileWriter::Write((uchar *)&MemWRT,in_EDX,(uint *)Buffer.m_Data);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&MemWRT);
          Kumu::Result_t::~Result_t((Result_t *)&MemWRT);
        }
      }
    }
    FrameBuffer::~FrameBuffer(&Buffer);
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x93,"virtual ASDCP::Result_t ASDCP::MXF::RIP::WriteToFile(Kumu::FileWriter &)");
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::RIP::WriteToFile(Kumu::FileWriter& Writer)
{
  assert(m_Dict);
  ASDCP::FrameBuffer Buffer;
  ui32_t RIPSize = ( PairArray.size() * (sizeof(ui32_t) + sizeof(ui64_t)) ) + 4;
  Result_t result = Buffer.Capacity(RIPSize);

  if ( ASDCP_SUCCESS(result) )
    result = WriteKLToFile(Writer, m_Dict->ul(MDD_RandomIndexMetadata), RIPSize);

  if ( ASDCP_SUCCESS(result) )
    {
      result = RESULT_KLV_CODING(__LINE__, __FILE__);

      Kumu::MemIOWriter MemWRT(Buffer.Data(), Buffer.Capacity());
      if ( PairArray.Archive(&MemWRT) )
	if ( MemWRT.WriteUi32BE(RIPSize + 20) )
	  {
	    Buffer.Size(MemWRT.Length());
	    result = RESULT_OK;
	  }
    }

  if ( ASDCP_SUCCESS(result) )
    result = Writer.Write(Buffer.RoData(), Buffer.Size());

  return result;
}